

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_ctstring.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  ostream *poVar2;
  size_t sVar3;
  size_t buf [77];
  
  printf("plain 1: %s\n","Hello");
  printf("plain 2: %s\n","HELLO");
  poVar2 = std::operator<<((ostream *)&std::cout,"xored: ");
  cts::string::string((string *)buf,0x4c);
  puVar1 = (undefined1 *)
           CONCAT17(buf[0]._7_1_,
                    CONCAT16(buf[0]._6_1_,
                             CONCAT15(buf[0]._5_1_,
                                      CONCAT14(buf[0]._4_1_,
                                               CONCAT13(buf[0]._3_1_,
                                                        CONCAT12(buf[0]._2_1_,
                                                                 CONCAT11(buf[0]._1_1_,
                                                                          (undefined1)buf[0])))))));
  sVar3 = cts::anon_unknown_2::decode(0x62210e1f,0,0x62210e59);
  *puVar1 = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xca852360,1,0xca8523e4);
  puVar1[1] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x12c29ca3,2,0x12c29df3);
  puVar1[2] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x27fac8f6,3,0x27facab6);
  puVar1[3] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xfcb5c72d,4,0xfcb5c29d);
  puVar1[4] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x7e896a18,5,0x7e896358);
  puVar1[5] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x1a961a57,6,0x1a960ed7);
  puVar1[6] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xd2f65e19,7,0xd2f65e4a);
  puVar1[7] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x51bd39a5,8,0x51bd3921);
  puVar1[8] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x5c0700a8,9,0x5c07000c);
  puVar1[9] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xb3fab90b,10,0xb3fabbfb);
  puVar1[10] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xa293842e,0xb,0xa293811e);
  puVar1[0xb] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xdf4c7f45,0xc,0xdf4c75e5);
  puVar1[0xc] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x8da73600,0xd,0x8da72e00);
  puVar1[0xd] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x88404971,0xe,0x8840495f);
  puVar1[0xe] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xef3587f6,0xf,0xef358732);
  puVar1[0xf] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xe9e6bd79,0x10,0xe9e6bce9);
  puVar1[0x10] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x7f2c622c,0x11,0x7f2c6134);
  puVar1[0x11] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xde7e9eb3,0x12,0xde7e9b03);
  puVar1[0x12] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x1deb08a6,0x13,0x1deb0486);
  puVar1[0x13] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xd64184ed,0x14,0xd641922d);
  puVar1[0x14] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x84664d9d,0x15,0x84664da8);
  puVar1[0x15] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4df9d435,0x16,0x4df9d4e7);
  puVar1[0x16] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x8781cc66,0x17,0x8781cd1a);
  puVar1[0x17] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xdd48ba89,0x18,0xdd48b9b1);
  puVar1[0x18] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x9565e1bc,0x19,0x9565e75c);
  puVar1[0x19] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4c657cb,0x1a,0x4c65b0b);
  puVar1[0x1a] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x66dae32e,0x1b,0x66daf4ee);
  puVar1[0x1b] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x9e623749,0x1c,0x9e623775);
  puVar1[0x1c] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xd3f16286,0x1d,0xd3f16250);
  puVar1[0x1d] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc6acd0db,0x1e,0xc6acd16f);
  puVar1[0x1e] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xa27ed39a,0x1f,0xa27ed002);
  puVar1[0x1f] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x53f24b79,0x20,0x53f24f79);
  puVar1[0x20] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xce383ee4,0x21,0xce383284);
  puVar1[0x21] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x84e05d3,0x22,0x84e1c13);
  puVar1[0x22] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x8570f215,0x23,0x8570f256);
  puVar1[0x23] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xae1f8553,0x24,0xae1f85bd);
  puVar1[0x24] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xb2c70a50,0x25,0xb2c70bf8);
  puVar1[0x25] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xca875daf,0x26,0xca875ef7);
  puVar1[0x26] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xbb4428ba,0x27,0xbb442fea);
  puVar1[0x27] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x97d69741,0x28,0x97d69e41);
  puVar1[0x28] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xe9bbfe2c,0x29,0xe9bbe2ac);
  puVar1[0x29] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x1a15fe63,0x2a,0x1a15fe1b);
  puVar1[0x2a] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x236e9c28,0x2b,0x236e9cbe);
  puVar1[0x2b] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x6a0e9cbd,0x2c,0x6a0e9d05);
  puVar1[0x2c] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc739e910,0x2d,0xc739eaa0);
  puVar1[0x2d] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x577b9abf,0x2e,0x577b9d7f);
  puVar1[0x2e] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4fdd82d2,0x2f,0x4fdd8cd2);
  puVar1[0x2f] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x514ce689,0x30,0x514cc609);
  puVar1[0x30] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4b1d975e,0x31,0x4b1d97d4);
  puVar1[0x31] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xab222187,0x32,0xab222123);
  puVar1[0x32] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc2c995c6,0x33,0xc2c99426);
  puVar1[0x33] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xe9689ea5,0x34,0xe9689d4d);
  puVar1[0x34] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x21f096d8,0x35,0x21f09e48);
  puVar1[0x35] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x49bfa2c7,0x36,0x49bfad07);
  puVar1[0x36] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x3fca99ba,0x37,0x3fca86ba);
  puVar1[0x37] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x538fe65b,0x38,0x538fe6d1);
  puVar1[0x38] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x5b1df14e,0x39,0x5b1df1fc);
  puVar1[0x39] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x6cfaa72b,0x3a,0x6cfaa52b);
  puVar1[0x3a] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc42b7c0e,0x3b,0xc42b788e);
  puVar1[0x3b] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4a8aae15,0x3c,0x4a8aa695);
  puVar1[0x3c] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x8865d7d0,0x3d,0x8865c6f0);
  puVar1[0x3d] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x244dba0f,0x3e,0x244dad8f);
  puVar1[0x3e] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xfa7ebd2c,0x3f,0xfa7ebda2);
  puVar1[0x3f] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xf93f21bd,0x40,0xf93f2099);
  puVar1[0x40] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x3a9190a0,0x41,0x3a919124);
  puVar1[0x41] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x622bae6b,0x42,0x622baa33);
  puVar1[0x42] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x3d71e0e6,0x43,0x3d71e9f6);
  puVar1[0x43] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x9775d45d,0x44,0x9775d8dd);
  puVar1[0x44] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xf6821d8,0x45,0xf680498);
  puVar1[0x45] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xe963bf98,0x46,0xe963bf17);
  puVar1[0x46] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x7de1d092,0x47,0x7de1d18a);
  puVar1[0x47] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x10dd914d,0x48,0x10dd9361);
  puVar1[0x48] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc4e1113c,0x49,0xc4e1154c);
  puVar1[0x49] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xfec559eb,0x4a,0xfec5503b);
  puVar1[0x4a] = (char)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xa02e85de,0x4b,0xa02e885e);
  puVar1[0x4b] = (char)sVar3;
  poVar2 = cts::operator<<(poVar2,(string *)buf);
  std::endl<char,std::char_traits<char>>(poVar2);
  cts::string::~string((string *)buf);
  sVar3 = cts::anon_unknown_2::decode(0x62210e1f,0,0x62210e59);
  buf[0]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xca852360,1,0xca8523e4);
  buf[0]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x12c29ca3,2,0x12c29df3);
  buf[0]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x27fac8f6,3,0x27facab6);
  buf[0]._3_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xfcb5c72d,4,0xfcb5c29d);
  buf[0]._4_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x7e896a18,5,0x7e896358);
  buf[0]._5_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x1a961a57,6,0x1a960ed7);
  buf[0]._6_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xd2f65e19,7,0xd2f65e4a);
  buf[0]._7_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x51bd39a5,8,0x51bd3921);
  buf[1]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x5c0700a8,9,0x5c07000c);
  buf[1]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xb3fab90b,10,0xb3fabbfb);
  buf[1]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xa293842e,0xb,0xa293811e);
  buf[1]._3_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xdf4c7f45,0xc,0xdf4c75e5);
  buf[1]._4_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x8da73600,0xd,0x8da72e00);
  buf[1]._5_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x88404971,0xe,0x8840495f);
  buf[1]._6_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xef3587f6,0xf,0xef358732);
  buf[1]._7_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xe9e6bd79,0x10,0xe9e6bce9);
  buf[2]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x7f2c622c,0x11,0x7f2c6134);
  buf[2]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xde7e9eb3,0x12,0xde7e9b03);
  buf[2]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x1deb08a6,0x13,0x1deb0486);
  buf[2]._3_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xd64184ed,0x14,0xd641922d);
  buf[2]._4_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x84664d9d,0x15,0x84664da8);
  buf[2]._5_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4df9d435,0x16,0x4df9d4e7);
  buf[2]._6_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x8781cc66,0x17,0x8781cd1a);
  buf[2]._7_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xdd48ba89,0x18,0xdd48b9b1);
  buf[3]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x9565e1bc,0x19,0x9565e75c);
  buf[3]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4c657cb,0x1a,0x4c65b0b);
  buf[3]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x66dae32e,0x1b,0x66daf4ee);
  buf[3]._3_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x9e623749,0x1c,0x9e623775);
  buf[3]._4_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xd3f16286,0x1d,0xd3f16250);
  buf[3]._5_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc6acd0db,0x1e,0xc6acd16f);
  buf[3]._6_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xa27ed39a,0x1f,0xa27ed002);
  buf[3]._7_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x53f24b79,0x20,0x53f24f79);
  buf[4]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xce383ee4,0x21,0xce383284);
  buf[4]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x84e05d3,0x22,0x84e1c13);
  buf[4]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x8570f215,0x23,0x8570f256);
  buf[4]._3_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xae1f8553,0x24,0xae1f85bd);
  buf[4]._4_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xb2c70a50,0x25,0xb2c70bf8);
  buf[4]._5_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xca875daf,0x26,0xca875ef7);
  buf[4]._6_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xbb4428ba,0x27,0xbb442fea);
  buf[4]._7_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x97d69741,0x28,0x97d69e41);
  buf[5]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xe9bbfe2c,0x29,0xe9bbe2ac);
  buf[5]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x1a15fe63,0x2a,0x1a15fe1b);
  buf[5]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x236e9c28,0x2b,0x236e9cbe);
  buf[5]._3_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x6a0e9cbd,0x2c,0x6a0e9d05);
  buf[5]._4_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc739e910,0x2d,0xc739eaa0);
  buf[5]._5_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x577b9abf,0x2e,0x577b9d7f);
  buf[5]._6_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4fdd82d2,0x2f,0x4fdd8cd2);
  buf[5]._7_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x514ce689,0x30,0x514cc609);
  buf[6]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4b1d975e,0x31,0x4b1d97d4);
  buf[6]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xab222187,0x32,0xab222123);
  buf[6]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc2c995c6,0x33,0xc2c99426);
  buf[6]._3_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xe9689ea5,0x34,0xe9689d4d);
  buf[6]._4_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x21f096d8,0x35,0x21f09e48);
  buf[6]._5_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x49bfa2c7,0x36,0x49bfad07);
  buf[6]._6_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x3fca99ba,0x37,0x3fca86ba);
  buf[6]._7_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x538fe65b,0x38,0x538fe6d1);
  buf[7]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x5b1df14e,0x39,0x5b1df1fc);
  buf[7]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x6cfaa72b,0x3a,0x6cfaa52b);
  buf[7]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc42b7c0e,0x3b,0xc42b788e);
  buf[7]._3_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x4a8aae15,0x3c,0x4a8aa695);
  buf[7]._4_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x8865d7d0,0x3d,0x8865c6f0);
  buf[7]._5_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x244dba0f,0x3e,0x244dad8f);
  buf[7]._6_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xfa7ebd2c,0x3f,0xfa7ebda2);
  buf[7]._7_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xf93f21bd,0x40,0xf93f2099);
  buf[8]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x3a9190a0,0x41,0x3a919124);
  buf[8]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x622bae6b,0x42,0x622baa33);
  buf[8]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x3d71e0e6,0x43,0x3d71e9f6);
  buf[8]._3_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x9775d45d,0x44,0x9775d8dd);
  buf[8]._4_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xf6821d8,0x45,0xf680498);
  buf[8]._5_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xe963bf98,0x46,0xe963bf17);
  buf[8]._6_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x7de1d092,0x47,0x7de1d18a);
  buf[8]._7_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0x10dd914d,0x48,0x10dd9361);
  buf[9]._0_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xc4e1113c,0x49,0xc4e1154c);
  buf[9]._1_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xfec559eb,0x4a,0xfec5503b);
  buf[9]._2_1_ = (undefined1)sVar3;
  sVar3 = cts::anon_unknown_2::decode(0xa02e85de,0x4b,0xa02e885e);
  buf[9]._3_1_ = (undefined1)sVar3;
  buf[9]._4_1_ = 0;
  printf("in-buf(xored): %s\n",buf);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	using namespace cts::literals;

	auto sample1 = "Hello"_chars;
	auto sample2 = "Hello"_ichars;

	//std::printf("%s = %u:%u:%u\n", __TIME__, CTS_TIME(0), CTS_TIME(3), CTS_TIME(6));
	std::printf("plain 1: %s\n", sample1.c_str());
	std::printf("plain 2: %s\n", sample2.c_str());

	{
		char constexpr csz[] = "Hello World";
		static_assert(sample1.match(csz, csz+sizeof(csz)), "");
		static_assert(sample2.match(csz, csz+sizeof(csz)), "");
	}
	{
		char constexpr csz[] = "hello world";
		static_assert(!sample1.match(csz, csz+sizeof(csz)), "");
		static_assert(sample2.match(csz, csz+sizeof(csz)), "");
	}

	auto sample3 = "HELLO"_chars;
	{
		char constexpr csz[] = "helLO worLD";
		static_assert(!sample3.match(csz, csz+sizeof(csz)), "");
		static_assert(sample3.match(csz, csz+sizeof(csz), 3), "");
		static_assert(!sample3.match(csz, csz+sizeof(csz), 5), "");
	}

	auto const xsHidden = "FAREWELL: THIS STRING SHOULD NOT BE SEEN IN BINARY EITHER FULL OR IN PIECES!"_xchars;
	std::cout << "xored: " << xsHidden.str() << std::endl;

	std::size_t buf[xsHidden.size()+1];
	std::printf("in-buf(xored): %s\n", xsHidden.str(buf));

	return 0;
}